

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isastubs.c
# Opt level: O1

parasail_result_t *
parasail_sg_qe_db_stats_rowcol_scan_profile_altivec_128_sat
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  *piVar1 = 0x26;
  return (parasail_result_t *)0x0;
}

Assistant:

extern
parasail_result_t* parasail_sg_qe_db_stats_rowcol_scan_profile_altivec_128_sat(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    UNUSED(profile);
    UNUSED(s2);
    UNUSED(s2Len);
    UNUSED(open);
    UNUSED(gap);
    errno = ENOSYS;
    return NULL;
}